

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bcatcstr(bstring b,char *s)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int local_2c;
  int l;
  int i;
  char *d;
  char *s_local;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) ||
     (((b->mlen < b->slen || (b->mlen < 1)) || (s == (char *)0x0)))) {
    b_local._4_4_ = -1;
  }
  else {
    iVar2 = b->mlen;
    iVar3 = b->slen;
    _l = b->data + b->slen;
    d = s;
    for (local_2c = 0; local_2c < iVar2 - iVar3; local_2c = local_2c + 1) {
      uVar1 = *d;
      *_l = uVar1;
      if (uVar1 == '\0') {
        b->slen = local_2c + b->slen;
        return 0;
      }
      _l = _l + 1;
      d = d + 1;
    }
    b->slen = local_2c + b->slen;
    sVar4 = strlen(d);
    b_local._4_4_ = bcatblk(b,d,(int)sVar4);
  }
  return b_local._4_4_;
}

Assistant:

int bcatcstr (bstring b, const char * s) {
char * d;
int i, l;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL) return BSTR_ERR;

	/* Optimistically concatenate directly */
	l = b->mlen - b->slen;
	d = (char *) &b->data[b->slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			b->slen += i;
			return BSTR_OK;
		}
	}
	b->slen += i;

	/* Need to explicitely resize and concatenate tail */
	return bcatblk (b, (const void *) s, (int) strlen (s));
}